

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
::clear(HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
        *this)

{
  bool bVar1;
  ulong uVar2;
  type puVar3;
  pointer __s;
  HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
  *in_RDI;
  HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
  *unaff_retaddr;
  u64 i;
  u64 capacity;
  size_t in_stack_ffffffffffffffd8;
  ulong local_18;
  HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
  *capacity_00;
  
  if (in_RDI->numElements != 0) {
    uVar2 = in_RDI->tableSizeMask + 1;
    capacity_00 = in_RDI;
    for (local_18 = 0; local_18 < uVar2; local_18 = local_18 + 1) {
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_RDI,in_stack_ffffffffffffffd8);
      bVar1 = occupied(in_RDI,*puVar3);
      if (bVar1) {
        std::
        unique_ptr<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
        ::get(&in_RDI->entries);
        HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
        ::~HighsHashTableEntry
                  ((HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                    *)0x64e5a6);
      }
    }
    if (uVar2 == 0x80) {
      __s = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI)
      ;
      memset(__s,0,0x80);
      in_RDI->numElements = 0;
    }
    else {
      makeEmptyTable(unaff_retaddr,(u64)capacity_00);
    }
  }
  return;
}

Assistant:

void clear() {
    if (numElements) {
      u64 capacity = tableSizeMask + 1;
      if (!std::is_trivially_destructible<Entry>::value) {
        for (u64 i = 0; i < capacity; ++i)
          if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
      if (capacity == 128) {
        std::memset(metadata.get(), 0, 128);
        numElements = 0;
      } else
        makeEmptyTable(128);
    }
  }